

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O0

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f *wo,Vector3f *wm)

{
  Vector3f *in_RSI;
  TrowbridgeReitzDistribution *in_RDI;
  Float FVar1;
  Float FVar2;
  float fVar3;
  Float FVar4;
  Vector3<float> *in_stack_ffffffffffffffc8;
  
  FVar1 = D(in_RDI,in_RSI);
  FVar2 = G1(in_RDI,in_stack_ffffffffffffffc8);
  fVar3 = AbsDot<float>((Vector3<float> *)in_RDI,in_stack_ffffffffffffffc8);
  FVar4 = AbsCosTheta((Vector3f *)0x50421d);
  return (FVar1 * FVar2 * fVar3) / FVar4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const Vector3f &wo, const Vector3f &wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }